

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O2

DateData * asl::Date::calc(DateData *__return_storage_ptr__,double t)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  
  if (NAN(t)) {
    __return_storage_ptr__->hours = 0;
    __return_storage_ptr__->minutes = 0;
    __return_storage_ptr__->seconds = 0;
    __return_storage_ptr__->weekDay = 0;
    __return_storage_ptr__->year = 0;
    __return_storage_ptr__->month = 0;
    __return_storage_ptr__->day = 0;
    __return_storage_ptr__->hours = 0;
  }
  else {
    uVar6 = yearFromTime(t);
    __return_storage_ptr__->year = uVar6;
    if ((uVar6 & 3) == 0) {
      if ((int)uVar6 % 100 == 0) {
        uVar11 = (ulong)((int)uVar6 % 400 == 0);
      }
      else {
        uVar11 = 1;
      }
    }
    else {
      uVar11 = 0;
    }
    lVar9 = 1;
    dVar3 = floor(t / 86400.0);
    dVar4 = floor((double)(int)(uVar6 - 0x7b1) * 0.25);
    dVar12 = floor((double)(int)(uVar6 - 0x76d) / 100.0);
    dVar5 = floor((double)(int)(uVar6 - 0x641) / 400.0);
    iVar8 = (int)(dVar3 - (dVar5 + ((dVar4 + (double)(int)(uVar6 * 0x16d + -0xaf8ca)) - dVar12)));
    __return_storage_ptr__->month = 1;
    lVar10 = (long)(iVar8 / 0x20) + -1;
    do {
      lVar1 = lVar10 + 1;
      if (0xc < lVar1) goto LAB_001398e5;
      lVar2 = lVar10 * 4;
      lVar10 = lVar1;
    } while (*(int *)(uVar11 * 0x38 + 0x141e58 + lVar2) <= iVar8);
    __return_storage_ptr__->month = (int)lVar1;
    lVar9 = lVar1;
LAB_001398e5:
    __return_storage_ptr__->day = (iVar8 - *(int *)(month_days + lVar9 * 4 + uVar11 * 0x38)) + 1;
    dVar3 = (t + 0.0005) / 86400.0;
    dVar4 = floor(dVar3);
    dVar12 = (dVar3 - dVar4) * 24.0;
    dVar3 = floor(dVar12);
    dVar12 = (dVar12 - (double)(int)dVar3) * 60.0;
    dVar5 = floor(dVar12);
    dVar12 = floor((dVar12 - (double)(int)dVar5) * 60.0);
    __return_storage_ptr__->hours = (int)dVar3;
    __return_storage_ptr__->minutes = (int)dVar5;
    __return_storage_ptr__->seconds = (int)dVar12;
    iVar8 = ((int)dVar4 + -3) % 7;
    iVar7 = iVar8 + 7;
    if (-1 < iVar8) {
      iVar7 = iVar8;
    }
    __return_storage_ptr__->weekDay = iVar7;
  }
  return __return_storage_ptr__;
}

Assistant:

DateData Date::calc(double t)
{
	DateData date;
	if (t != t)
	{
		memset(&date, 0, sizeof(date));
		return date;
	}
	date.year = yearFromTime(t);
	int leap = isLeapYear(t) ? 1 : 0;
	int yd = (int)dayWithinYear(t, date.year);
	date.month = 1;

	for (int i = yd / 32; i < 13; i++)
	{
		if (yd < month_days[leap][i + 1])
		{
			date.month = i;
			break;
		}
	}
	date.day = yd - month_days[leap][date.month] + 1;

	t += 0.0005;
	double dt = ((t / 86400.0) - floor(t / 86400.0));
	int    h = (int)floor(24 * dt);
	int    m = (int)floor((24 * dt - h) * 60);
	int    s = (int)floor(((24 * dt - h) * 60 - m) * 60.0);
	
	date.hours = h;
	date.minutes = m;
	date.seconds = s;
	date.weekDay = ((int)floor(t / 86400.0) - 3) % 7;
	if (date.weekDay < 0)
		date.weekDay += 7;
	return date;
}